

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic4::Run(UnitTest_semantic4 *this)

{
  size_type sVar1;
  size_type sVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  allocator local_71;
  string local_70;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_50;
  allocator local_48 [32];
  
  std::__cxx11::string::string((string *)&local_70,"t.m.n = a",local_48);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_70._M_dataplus._M_p = (pointer)&PTR__Visitor_00197750;
  local_70._M_string_length = 0;
  (*(local_50._M_head_impl)->_vptr_SyntaxTree[2])(local_50._M_head_impl,&local_70,0);
  sVar1 = local_70._M_string_length;
  local_70._M_dataplus._M_p = (pointer)&PTR__Visitor_00197898;
  local_70._M_string_length = 0;
  (*(local_50._M_head_impl)->_vptr_SyntaxTree[2])(local_50._M_head_impl,&local_70,0);
  sVar2 = local_70._M_string_length;
  std::__cxx11::string::string((string *)local_48,"t",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string((string *)local_48,"a",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_50,(FindName *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  if (*(int *)(sVar1 + 0x30) != 2) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'t_m_n->semantic_ == luna::SemanticOp_Write\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (*(int *)(sVar2 + 0x30) != 1) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'t_m->semantic_ == luna::SemanticOp_Read\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pTVar3->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'t->semantic_ == luna::SemanticOp_Read\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pTVar4->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_70,"\'a->semantic_ == luna::SemanticOp_Read\'",local_48);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (local_50._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_50._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic4)
{
    auto ast = Semantic("t.m.n = a");
    auto t_m_n = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "n";
    });
    auto t_m = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "m";
    });
    auto t = ASTFind<luna::Terminator>(ast, FindName("t"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    EXPECT_TRUE(t_m_n->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(t_m->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(t->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
}